

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::TableViewCellLayout::setGeometry(TableViewCellLayout *this,QRect *rect)

{
  int *this_00;
  QWidget *pQVar1;
  TextLabel *pTVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int aw;
  int iVar10;
  int local_26c;
  byte local_262;
  int local_234;
  byte local_209;
  bool local_184;
  byte local_181;
  int offset_1;
  QString local_128;
  int local_110;
  byte local_109;
  int offset;
  QString local_f0;
  QSize local_d4;
  QSize imageSize;
  QString local_a8;
  byte local_89;
  QString local_88;
  QLabel local_60 [28];
  QSize local_44;
  QSize accessorySizeHint;
  int imageOffset;
  QRect r;
  QMargins m;
  QRect *rect_local;
  TableViewCellLayout *this_local;
  
  QLayout::setGeometry((QRect *)this);
  r._8_8_ = QLayout::contentsMargins();
  this_00 = &r.x2;
  iVar6 = QMargins::left((QMargins *)this_00);
  iVar7 = QMargins::top((QMargins *)this_00);
  iVar8 = QMargins::right((QMargins *)this_00);
  iVar9 = QMargins::bottom((QMargins *)this_00);
  join_0x00000010_0x00000000_ = QRect::adjusted(rect,iVar6,iVar7,-iVar8,-iVar9);
  accessorySizeHint.wd = 0;
  local_44 = (QSize)(**(code **)(*(long *)this->accessoryWidget + 0x70))();
  QLabel::pixmap(local_60,(ReturnByValueConstant)this->imageLabel);
  local_89 = 0;
  bVar3 = QPixmap::isNull();
  local_181 = 1;
  if ((bVar3 & 1) == 0) {
    QLabel::text();
    local_89 = 1;
    bVar4 = QString::isEmpty(&local_88);
    local_181 = bVar4 ^ 0xff;
  }
  if ((local_89 & 1) != 0) {
    QString::~QString(&local_88);
  }
  QPixmap::~QPixmap((QPixmap *)local_60);
  if ((local_181 & 1) == 0) {
    pQVar1 = (QWidget *)this->imageLabel;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry(pQVar1,iVar6,iVar7,0,0);
  }
  else {
    bVar5 = QSize::isEmpty(&local_44);
    bVar4 = false;
    imageSize.wd._3_1_ = 0;
    local_184 = false;
    if (bVar5) {
      TextLabel::text(&local_a8,this->textLabel);
      bVar4 = true;
      bVar5 = QString::isEmpty(&local_a8);
      local_184 = false;
      if (bVar5) {
        TextLabel::text((QString *)&imageSize.ht,this->detailedTextLabel);
        imageSize.wd._3_1_ = 1;
        local_184 = QString::isEmpty((QString *)&imageSize.ht);
      }
    }
    if ((imageSize.wd._3_1_ & 1) != 0) {
      QString::~QString((QString *)&imageSize.ht);
    }
    if (bVar4) {
      QString::~QString(&local_a8);
    }
    if (local_184 != false) {
      QWidget::setGeometry((QRect *)this->imageLabel);
      pTVar2 = this->textLabel;
      iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
      iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
      QWidget::setGeometry((QWidget *)pTVar2,iVar6,iVar7,0,0);
      pTVar2 = this->detailedTextLabel;
      iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
      iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
      QWidget::setGeometry((QWidget *)pTVar2,iVar6,iVar7,0,0);
      pQVar1 = this->accessoryWidget;
      iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
      iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
      QWidget::setGeometry(pQVar1,iVar6,iVar7,0,0);
      return;
    }
    local_d4 = (QSize)(**(code **)(*(long *)this->imageLabel + 0x70))();
    pQVar1 = (QWidget *)this->imageLabel;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    iVar8 = QSize::width(&local_d4);
    iVar9 = QSize::height(&local_d4);
    QWidget::setGeometry(pQVar1,iVar6,iVar7,iVar8,iVar9);
    iVar6 = QSize::width(&local_d4);
    iVar7 = (**(code **)(*(long *)this + 0x60))();
    accessorySizeHint.wd = iVar6 + iVar7 + accessorySizeHint.wd;
  }
  bVar4 = QSize::isEmpty(&local_44);
  if (bVar4) {
    pQVar1 = this->accessoryWidget;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry(pQVar1,iVar6,iVar7,0,0);
    setTextGeometry(this,(QRect *)&accessorySizeHint.ht,accessorySizeHint.wd,0);
    return;
  }
  TextLabel::text(&local_f0,this->textLabel);
  local_109 = 0;
  bVar4 = QString::isEmpty(&local_f0);
  local_209 = 0;
  if (bVar4) {
    TextLabel::text((QString *)&offset,this->detailedTextLabel);
    local_109 = 1;
    bVar4 = QString::isEmpty((QString *)&offset);
    local_209 = 0;
    if (bVar4) {
      bVar4 = QSize::isEmpty(&local_44);
      local_209 = bVar4 ^ 0xff;
    }
  }
  if ((local_109 & 1) != 0) {
    QString::~QString((QString *)&offset);
  }
  QString::~QString(&local_f0);
  if ((local_209 & 1) != 0) {
    pTVar2 = this->textLabel;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry((QWidget *)pTVar2,iVar6,iVar7,0,0);
    pTVar2 = this->detailedTextLabel;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry((QWidget *)pTVar2,iVar6,iVar7,0,0);
    iVar6 = QSize::height(&local_44);
    iVar7 = QRect::height((QRect *)&accessorySizeHint.ht);
    if (iVar6 < iVar7) {
      iVar6 = QRect::height((QRect *)&accessorySizeHint.ht);
      iVar7 = QSize::height(&local_44);
      local_234 = (iVar6 - iVar7) / 2;
    }
    else {
      local_234 = 0;
    }
    local_110 = local_234;
    pQVar1 = this->accessoryWidget;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar6 = iVar6 + accessorySizeHint.wd;
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    iVar7 = iVar7 + local_110;
    iVar8 = QRect::width((QRect *)&accessorySizeHint.ht);
    iVar8 = iVar8 - accessorySizeHint.wd;
    iVar9 = QRect::height((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry(pQVar1,iVar6,iVar7,iVar8,iVar9 + local_110 * -2);
    return;
  }
  TextLabel::text(&local_128,this->textLabel);
  bVar4 = false;
  bVar5 = QString::isEmpty(&local_128);
  if (bVar5) {
    TextLabel::text((QString *)&offset_1,this->detailedTextLabel);
    bVar4 = true;
    bVar5 = QString::isEmpty((QString *)&offset_1);
    local_262 = 0;
    if (bVar5) goto LAB_001be144;
  }
  bVar5 = QSize::isEmpty(&local_44);
  local_262 = bVar5 ^ 0xff;
LAB_001be144:
  if (bVar4) {
    QString::~QString((QString *)&offset_1);
  }
  QString::~QString(&local_128);
  if ((local_262 & 1) == 0) {
    pTVar2 = this->textLabel;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry((QWidget *)pTVar2,iVar6,iVar7,0,0);
    pTVar2 = this->detailedTextLabel;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry((QWidget *)pTVar2,iVar6,iVar7,0,0);
    pQVar1 = this->accessoryWidget;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::y((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry(pQVar1,iVar6,iVar7,0,0);
  }
  else {
    iVar6 = QSize::height(&local_44);
    iVar7 = QRect::height((QRect *)&accessorySizeHint.ht);
    if (iVar6 < iVar7) {
      iVar6 = QRect::height((QRect *)&accessorySizeHint.ht);
      iVar7 = QSize::height(&local_44);
      local_26c = (iVar6 - iVar7) / 2;
    }
    else {
      local_26c = 0;
    }
    pQVar1 = this->accessoryWidget;
    iVar6 = QRect::x((QRect *)&accessorySizeHint.ht);
    iVar7 = QRect::width((QRect *)&accessorySizeHint.ht);
    iVar8 = QSize::width(&local_44);
    iVar9 = QRect::y((QRect *)&accessorySizeHint.ht);
    aw = QSize::width(&local_44);
    iVar10 = QRect::height((QRect *)&accessorySizeHint.ht);
    QWidget::setGeometry
              (pQVar1,(iVar6 + iVar7) - iVar8,iVar9 + local_26c,aw,iVar10 + local_26c * -2);
    iVar6 = accessorySizeHint.wd;
    iVar7 = QSize::width(&local_44);
    setTextGeometry(this,(QRect *)&accessorySizeHint.ht,iVar6,iVar7);
  }
  return;
}

Assistant:

void
TableViewCellLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int imageOffset = 0;

	const QSize accessorySizeHint = accessoryWidget->sizeHint();

	if( imageLabel->pixmap( Qt::ReturnByValue ).isNull() || !imageLabel->text().isEmpty() )
	{
		if( accessorySizeHint.isEmpty() && textLabel->text().isEmpty() &&
			detailedTextLabel->text().isEmpty() )
		{
			imageLabel->setGeometry( r );
			textLabel->setGeometry( r.x(), r.y(), 0, 0 );
			detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
			accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

			return;
		}

		const QSize imageSize = imageLabel->sizeHint();

		imageLabel->setGeometry( r.x(), r.y(),
			imageSize.width(), imageSize.height() );

		imageOffset += imageSize.width() + spacing();
	}
	else
		imageLabel->setGeometry( r.x(), r.y(), 0, 0 );

	if( accessorySizeHint.isEmpty() )
	{
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

		setTextGeometry( r, imageOffset, 0 );
	}
	else if( textLabel->text().isEmpty() && detailedTextLabel->text().isEmpty() &&
		!accessorySizeHint.isEmpty() )
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );

		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + imageOffset, r.y() + offset,
			r.width() - imageOffset, r.height() - offset * 2 );
	}
	else if( ( !textLabel->text().isEmpty() || !detailedTextLabel->text().isEmpty() ) &&
		!accessorySizeHint.isEmpty() )
	{
		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + r.width() -
			accessorySizeHint.width(), r.y() + offset,
			accessorySizeHint.width(), r.height() - offset * 2 );

		setTextGeometry( r, imageOffset, accessorySizeHint.width() );
	}
	else
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );
	}
}